

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void test_EbGb(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  (pMyDisasm->Instruction).Category = 0x10005;
  strcpy((pMyDisasm->Instruction).Mnemonic,"test");
  (pMyDisasm->Operand1).AccessMode = 1;
  EbGb(pMyDisasm);
  FillFlags(pMyDisasm,0x68);
  return;
}

Assistant:

void __bea_callspec__ test_EbGb(PDISASM pMyDisasm)
{
  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+BIT_UInt8;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "test");
  #endif
  pMyDisasm->Operand1.AccessMode = READ;
  EbGb(pMyDisasm);
  FillFlags(pMyDisasm,104);
}